

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O1

bool __thiscall
FOptionMenuItemOptionBase::MenuEvent(FOptionMenuItemOptionBase *this,int mkey,bool fromcontroller)

{
  FOptionValues **ppFVar1;
  uint uVar2;
  Node *pNVar3;
  bool bVar4;
  int iVar5;
  Node *pNVar6;
  ulong uVar7;
  FSoundID local_24;
  
  uVar2 = *(uint *)&(this->super_FOptionMenuItem).field_0x24;
  pNVar3 = OptionValues.Nodes + (OptionValues.Size - 1 & uVar2);
  do {
    pNVar6 = pNVar3;
    if ((pNVar6 == (Node *)0x0) || (pNVar6->Next == (Node *)0x1)) {
      pNVar6 = (Node *)0x0;
      break;
    }
    pNVar3 = pNVar6->Next;
  } while ((pNVar6->Pair).Key.Index != uVar2);
  ppFVar1 = &(pNVar6->Pair).Value;
  if (((pNVar6 != (Node *)0x0) && (*ppFVar1 != (FOptionValues *)0x0)) &&
     (((*ppFVar1)->mValues).Count != 0)) {
    iVar5 = (*(this->super_FOptionMenuItem).super_FListMenuItem._vptr_FListMenuItem[0x13])(this);
    if ((mkey == 6) || (mkey == 3)) {
      uVar7 = 0;
      if ((int)(iVar5 + 1U) < (int)((*ppFVar1)->mValues).Count) {
        uVar7 = (ulong)(iVar5 + 1U);
      }
    }
    else {
      if (mkey != 2) goto LAB_0033035e;
      if (iVar5 == -1) {
        uVar7 = 0;
      }
      else if (iVar5 < 1) {
        uVar7 = (ulong)(((*ppFVar1)->mValues).Count - 1);
      }
      else {
        uVar7 = (ulong)(iVar5 - 1);
      }
    }
    (*(this->super_FOptionMenuItem).super_FListMenuItem._vptr_FListMenuItem[0x14])(this,uVar7);
    S_FindSound("menu/change");
    S_Sound(0x22,&local_24,snd_menuvolume.Value,0.0);
    return true;
  }
LAB_0033035e:
  bVar4 = FListMenuItem::MenuEvent((FListMenuItem *)this,mkey,fromcontroller);
  return bVar4;
}

Assistant:

bool MenuEvent (int mkey, bool fromcontroller)
	{
		FOptionValues **opt = OptionValues.CheckKey(mValues);
		if (opt != NULL && *opt != NULL && (*opt)->mValues.Size() > 0)
		{
			int Selection = GetSelection();
			if (mkey == MKEY_Left)
			{
				if (Selection == -1) Selection = 0;
				else if (--Selection < 0) Selection = (*opt)->mValues.Size()-1;
			}
			else if (mkey == MKEY_Right || mkey == MKEY_Enter)
			{
				if (++Selection >= (int)(*opt)->mValues.Size()) Selection = 0;
			}
			else
			{
				return FOptionMenuItem::MenuEvent(mkey, fromcontroller);
			}
			SetSelection(Selection);
			S_Sound (CHAN_VOICE | CHAN_UI, "menu/change", snd_menuvolume, ATTN_NONE);
		}
		else
		{
			return FOptionMenuItem::MenuEvent(mkey, fromcontroller);
		}
		return true;
	}